

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O0

int cmd_getprefdir(char *args)

{
  char *pcVar1;
  undefined8 uVar2;
  char *ptr;
  char *appName;
  char *org;
  char *args_local;
  
  pcVar1 = strchr(args,0x20);
  *pcVar1 = '\0';
  uVar2 = PHYSFS_getPrefDir(args,pcVar1 + 1);
  printf("Pref dir is [%s].\n",uVar2);
  return 1;
}

Assistant:

static int cmd_getprefdir(char *args)
{
    char *org;
    char *appName;
    char *ptr = args;

    org = ptr;
    ptr = strchr(ptr, ' '); *ptr = '\0'; ptr++; appName = ptr;
    printf("Pref dir is [%s].\n", PHYSFS_getPrefDir(org, appName));
    return 1;
}